

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O1

void __thiscall
Object_KeyNeedingQuoting_Test<wchar_t>::TestBody(Object_KeyNeedingQuoting_Test<wchar_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  allocator_type *__a;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf;
  char *message;
  initializer_list<pstore::dump::object::member> __l;
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> expected;
  __string_type actual;
  object v;
  AssertHelper local_d0;
  value_ptr local_c8;
  undefined1 local_b8 [8];
  pointer pmStack_b0;
  pointer pmStack_a8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_98;
  member local_78;
  undefined1 local_48 [8];
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_40;
  undefined1 local_28;
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"  k1","");
  local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0298;
  local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__number_base_001f54a0;
  local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = pstore::dump::number_base::default_base_;
  local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__number_base_001f5660;
  local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x2a;
  pstore::dump::object::member::member(&local_78,(string *)&local_98,&local_c8);
  __a = (allocator_type *)&local_d0;
  __l._M_len = 1;
  __l._M_array = &local_78;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            ((vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> *)
             local_b8,__l,__a);
  local_48 = (undefined1  [8])&PTR__object_001f5ba0;
  local_40.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
  local_40.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = pmStack_b0;
  local_40.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pmStack_a8;
  local_b8 = (undefined1  [8])0x0;
  pmStack_b0 = (pointer)0x0;
  pmStack_a8 = (pointer)0x0;
  local_28 = 0;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            ((vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> *)
             local_b8);
  __buf = extraout_RDX;
  if (local_78.val.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.val.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    __buf = extraout_RDX_00;
  }
  paVar2 = &local_78.property.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.property._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.property._M_dataplus._M_p,
                    local_78.property.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_01;
  }
  if (local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    __buf = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_03;
  }
  pstore::dump::value::write((value *)local_48,(int)this + 0x10,__buf,(size_t)__a);
  std::__cxx11::wstringbuf::str();
  convert<wchar_t>(&local_98,"\"  k1\" : 0x2a");
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)local_b8,"expected","actual",&local_98,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&local_78
            );
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (pmStack_b0 == (pointer)0x0) {
      message = "";
    }
    else {
      message = (pmStack_b0->property)._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x76,message);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(local_c8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_value[1])();
    }
  }
  if (pmStack_b0 != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pmStack_b0,&pmStack_b0->property);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.property._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.property._M_dataplus._M_p,
                    local_78.property.field_2._M_allocated_capacity * 4 + 4);
  }
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_40);
  pstore::dump::number_base::~number_base((number_base *)local_48);
  return;
}

Assistant:

TYPED_TEST (Object, KeyNeedingQuoting) {
    using namespace ::pstore::dump;
    object v{{
        {"  k1", make_number (42)},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("\"  k1\" : 0x2a");
    EXPECT_EQ (expected, actual);
}